

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O0

int GetAllObstaclesDist5
              (uchar *scanline,uchar threshold,int diffstep,double minDist,double maxDist,int NBins,
              int RangeScale,uchar ADLow,uchar ADSpan,int adc8on,
              vector<interval,_std::allocator<interval>_> *distances)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  double local_e0;
  interval local_d8;
  double local_c0;
  interval local_b8;
  interval local_a0;
  void *local_88;
  uchar *scanlinethreshhold;
  double d1;
  double d0;
  int local_68;
  int i;
  int local_60;
  int local_5c;
  int maxBin;
  int local_54;
  double dStack_50;
  int minBin;
  double r1;
  double r0;
  int local_38;
  int iStack_34;
  uchar ADLow_local;
  int RangeScale_local;
  int NBins_local;
  double maxDist_local;
  double minDist_local;
  int diffstep_local;
  uchar threshold_local;
  uchar *scanline_local;
  
  r1 = (double)NBins / (double)RangeScale;
  dStack_50 = (double)RangeScale / (double)NBins;
  maxBin = 0;
  local_5c = (int)(minDist * r1);
  r0._7_1_ = ADLow;
  local_38 = RangeScale;
  iStack_34 = NBins;
  _RangeScale_local = maxDist;
  maxDist_local = minDist;
  minDist_local._0_4_ = diffstep;
  minDist_local._7_1_ = threshold;
  _diffstep_local = scanline;
  piVar3 = std::max<int>(&maxBin,&local_5c);
  local_54 = *piVar3;
  i = iStack_34 + -1;
  local_68 = (int)(_RangeScale_local * r1);
  piVar3 = std::min<int>(&i,&local_68);
  local_60 = *piVar3;
  d0._4_4_ = 0;
  d1 = -1.0;
  scanlinethreshhold = (uchar *)0xbff0000000000000;
  local_88 = (void *)0x0;
  local_88 = malloc((long)iStack_34);
  if (local_88 == (void *)0x0) {
    scanline_local._4_4_ = 1;
  }
  else {
    for (d0._4_4_ = local_54; d0._4_4_ <= local_60; d0._4_4_ = d0._4_4_ + 1) {
      bVar1 = DynamicRangeControl(_diffstep_local[d0._4_4_],r0._7_1_,ADSpan,adc8on);
      if (bVar1 < minDist_local._7_1_) {
        *(undefined1 *)((long)local_88 + (long)d0._4_4_) = 0;
      }
      else {
        *(undefined1 *)((long)local_88 + (long)d0._4_4_) = 0xff;
      }
    }
    for (d0._4_4_ = local_54; d0._4_4_ <= local_60 - minDist_local._0_4_; d0._4_4_ = d0._4_4_ + 1) {
      iVar2 = (uint)*(byte *)((long)local_88 + (long)(d0._4_4_ + minDist_local._0_4_)) -
              (uint)*(byte *)((long)local_88 + (long)d0._4_4_);
      if (iVar2 < 1) {
        iVar2 = -iVar2;
      }
      if (iVar2 < 0xff) {
        if (0.0 <= d1) {
          scanlinethreshhold = (uchar *)((double)(d0._4_4_ + -1) * dStack_50);
          interval::interval(&local_a0,&d1,(double *)&scanlinethreshhold);
          std::vector<interval,_std::allocator<interval>_>::push_back(distances,&local_a0);
          d1 = -1.0;
          scanlinethreshhold = (uchar *)0xbff0000000000000;
        }
      }
      else if (d1 < 0.0) {
        d1 = (double)d0._4_4_ * dStack_50;
      }
    }
    if (d1 < 0.0) {
      local_e0 = std::numeric_limits<double>::infinity();
      interval::interval(&local_d8,(double *)&RangeScale_local,&local_e0);
      std::vector<interval,_std::allocator<interval>_>::push_back(distances,&local_d8);
    }
    else {
      local_c0 = std::numeric_limits<double>::infinity();
      interval::interval(&local_b8,&d1,&local_c0);
      std::vector<interval,_std::allocator<interval>_>::push_back(distances,&local_b8);
    }
    free(local_88);
    scanline_local._4_4_ = 0;
  }
  return scanline_local._4_4_;
}

Assistant:

inline int GetAllObstaclesDist5(unsigned char* scanline, unsigned char threshold, int diffstep, double minDist, double maxDist, 
								int NBins, int RangeScale, unsigned char ADLow, unsigned char ADSpan, int adc8on, vector<interval>& distances)
{
	double r0 = (double)NBins/(double)RangeScale;
	double r1 = (double)RangeScale/(double)NBins;
	int minBin = max(0, (int)(minDist*r0));
	int maxBin = min(NBins-1, (int)(maxDist*r0));
	int i = 0;
	double d0 = -1, d1 = -1;
	unsigned char* scanlinethreshhold = NULL;

	scanlinethreshhold = (unsigned char*)malloc(NBins*sizeof(unsigned char));
	if (scanlinethreshhold == NULL)
	{
		return EXIT_FAILURE;
	}

	i = minBin;
	while (i <= maxBin)
	{
		if (DynamicRangeControl(scanline[i], ADLow, ADSpan, adc8on) >= threshold)
		{
			scanlinethreshhold[i] = 255;
		}
		else
		{
			scanlinethreshhold[i] = 0;
		}
		i++;
	}

	i = minBin;
	while (i <= maxBin-diffstep)
	{
		if (abs((int)(scanlinethreshhold[i+diffstep]-scanlinethreshhold[i])) >= 255)
		{
			if (d0 < 0) 
			{
				d0 = (double)i*r1; // Convert in m.
			}
		}
		else
		{
			if (d0 >= 0) 
			{
				d1 = (double)(i-1)*r1; // Convert in m.
				distances.push_back(interval(d0, d1));
				d0 = -1;
				d1 = -1;
			}
		}
		i++;
	}

	if (d0 >= 0) 
	{
		distances.push_back(interval(d0, oo));
	}
	else
	{
		distances.push_back(interval(maxDist, oo));
	}

	free(scanlinethreshhold);

	return EXIT_SUCCESS;
}